

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O1

void __thiscall
myvk::ImGuiRenderer::CmdDrawPipeline
          (ImGuiRenderer *this,Ptr<CommandBuffer> *command_buffer,uint32_t current_frame)

{
  VkOffset2D *pVVar1;
  undefined8 uVar2;
  pointer psVar3;
  element_type *peVar4;
  ulong uVar5;
  VkOffset2D VVar6;
  ImDrawList *pIVar7;
  ImDrawCmd *pIVar8;
  code *pcVar9;
  CommandBuffer *this_00;
  VkOffset2D VVar10;
  VkOffset2D VVar11;
  undefined8 uVar12;
  int iVar13;
  undefined4 extraout_var;
  ImDrawData *pIVar14;
  long lVar15;
  long lVar16;
  void *__dest;
  void *__dest_00;
  VkOffset2D *pVVar17;
  int iVar18;
  int iVar20;
  undefined1 auVar19 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  initializer_list<VkRect2D> __l;
  int local_d0;
  int local_cc;
  allocator_type local_c1;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [44];
  float local_8c;
  undefined1 local_88 [16];
  pointer local_78;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImDrawData *local_58;
  long local_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  local_b8._24_8_ = command_buffer;
  local_b8._32_8_ = this;
  iVar13 = (*(((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pIVar14 = ImGui::GetDrawData();
  iVar18 = (int)((pIVar14->FramebufferScale).x * (pIVar14->DisplaySize).x);
  iVar20 = (int)((pIVar14->FramebufferScale).y * (pIVar14->DisplaySize).y);
  local_68 = (ImVec2)CONCAT44(iVar20,iVar18);
  uStack_60 = 0;
  auVar23._0_4_ = -(uint)(0 < iVar18);
  auVar23._4_4_ = -(uint)(0 < iVar18);
  auVar23._8_4_ = -(uint)(0 < iVar20);
  auVar23._12_4_ = -(uint)(0 < iVar20);
  iVar18 = movmskpd((int)pIVar14,auVar23);
  if ((iVar18 == 3) && (lVar15 = (long)pIVar14->TotalVtxCount, lVar15 != 0)) {
    psVar3 = (((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
                *)(local_b8._32_8_ + 0x68))->
             super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pVVar1 = (VkOffset2D *)(psVar3 + current_frame);
    pVVar17 = (VkOffset2D *)
              ((((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
                  *)(local_b8._32_8_ + 0x80))->
               super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
               )._M_impl.super__Vector_impl_data._M_start + current_frame);
    lVar16 = (long)pIVar14->TotalIdxCount;
    peVar4 = psVar3[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar4 == (element_type *)0x0) ||
       ((uVar5 = (peVar4->super_BufferBase).m_size, uVar5 < (ulong)(lVar15 * 0x14) ||
        ((ulong)(lVar15 * 0x50) < uVar5)))) {
      local_88 = (undefined1  [16])0x0;
      local_78 = (pointer)0x0;
      Buffer::Create((Buffer *)local_b8,(Ptr<Device> *)CONCAT44(extraout_var,iVar13),lVar15 * 0x28,
                     0x804,0x80,VMA_MEMORY_USAGE_AUTO,
                     (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                      *)local_88);
      uVar2 = local_b8._0_8_;
      VVar10.y = local_b8._12_4_;
      VVar10.x = local_b8._8_4_;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      uVar12 = local_b8._0_8_;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      VVar6 = pVVar1[1];
      local_b8._0_4_ = (undefined4)uVar2;
      local_b8._4_4_ = SUB84(uVar2,4);
      pVVar1->x = local_b8._0_4_;
      pVVar1->y = local_b8._4_4_;
      pVVar1[1] = VVar10;
      local_b8._0_8_ = uVar12;
      if (VVar6 != (VkOffset2D)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)VVar6);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_b8._12_4_,local_b8._8_4_)
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_b8._12_4_,local_b8._8_4_));
      }
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)local_88);
    }
    if (((*pVVar17 == (VkOffset2D)0x0) ||
        (uVar5 = *(ulong *)((long)*pVVar17 + 0x20), uVar5 < (ulong)(lVar16 * 2))) ||
       ((ulong)(lVar16 * 8) < uVar5)) {
      local_88 = (undefined1  [16])0x0;
      local_78 = (pointer)0x0;
      Buffer::Create((Buffer *)local_b8,(Ptr<Device> *)CONCAT44(extraout_var,iVar13),lVar16 << 2,
                     0x804,0x40,VMA_MEMORY_USAGE_AUTO,
                     (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                      *)local_88);
      uVar2 = local_b8._0_8_;
      VVar11.y = local_b8._12_4_;
      VVar11.x = local_b8._8_4_;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      uVar12 = local_b8._0_8_;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      VVar6 = pVVar17[1];
      local_b8._0_4_ = (undefined4)uVar2;
      local_b8._4_4_ = SUB84(uVar2,4);
      pVVar17->x = local_b8._0_4_;
      pVVar17->y = local_b8._4_4_;
      pVVar17[1] = VVar11;
      local_b8._0_8_ = uVar12;
      if (VVar6 != (VkOffset2D)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)VVar6);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_b8._12_4_,local_b8._8_4_)
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_b8._12_4_,local_b8._8_4_));
      }
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)local_88);
    }
    if (0 < pIVar14->CmdListsCount) {
      __dest = *(void **)((long)*pVVar17 + 0x40);
      __dest_00 = *(void **)((long)*pVVar1 + 0x40);
      lVar15 = 0;
      do {
        pIVar7 = pIVar14->CmdLists[lVar15];
        lVar16 = (long)(pIVar7->VtxBuffer).Size;
        if (lVar16 != 0) {
          memmove(__dest_00,(pIVar7->VtxBuffer).Data,lVar16 * 0x14);
        }
        lVar16 = (long)(pIVar7->IdxBuffer).Size;
        if (lVar16 != 0) {
          memmove(__dest,(pIVar7->IdxBuffer).Data,lVar16 * 2);
        }
        __dest_00 = (void *)((long)__dest_00 + (long)(pIVar7->VtxBuffer).Size * 0x14);
        __dest = (void *)((long)__dest + (long)(pIVar7->IdxBuffer).Size * 2);
        lVar15 = lVar15 + 1;
      } while (lVar15 < pIVar14->CmdListsCount);
    }
    local_bc = (int)local_68.x;
    local_c0 = (int)local_68.y;
    setup_render_state((ImGuiRenderer *)local_b8._32_8_,(Ptr<CommandBuffer> *)local_b8._24_8_,
                       (int)local_68.x,(int)local_68.y,current_frame);
    if (0 < pIVar14->CmdListsCount) {
      local_68 = pIVar14->DisplayPos;
      uStack_60 = 0;
      local_8c = (float)local_bc;
      local_48 = pIVar14->FramebufferScale;
      uStack_40 = 0;
      local_b8._40_4_ = (undefined4)local_c0;
      local_50 = 0;
      local_cc = 0;
      local_d0 = 0;
      local_58 = pIVar14;
      do {
        pIVar7 = local_58->CmdLists[local_50];
        if (0 < (pIVar7->CmdBuffer).Size) {
          lVar16 = 0;
          lVar15 = 0;
          do {
            pIVar8 = (pIVar7->CmdBuffer).Data;
            pcVar9 = *(code **)((long)&pIVar8->UserCallback + lVar16);
            if (pcVar9 == (code *)0x0) {
              uVar2 = *(undefined8 *)((long)&(pIVar8->ClipRect).x + lVar16);
              auVar19._0_4_ = ((float)uVar2 - local_68.x) * local_48.x;
              auVar19._4_4_ = ((float)((ulong)uVar2 >> 0x20) - local_68.y) * local_48.y;
              auVar19._8_4_ = (0.0 - (float)uStack_60) * (float)uStack_40;
              auVar19._12_4_ = (0.0 - uStack_60._4_4_) * uStack_40._4_4_;
              if (auVar19._0_4_ < local_8c) {
                if (auVar19._4_4_ < (float)local_b8._40_4_) {
                  uVar2 = *(undefined8 *)((long)&(pIVar8->ClipRect).z + lVar16);
                  fVar21 = ((float)uVar2 - local_68.x) * local_48.x;
                  fVar22 = ((float)((ulong)uVar2 >> 0x20) - local_68.y) * local_48.y;
                  if ((0.0 <= fVar21) && (0.0 <= fVar22)) {
                    this_00 = *(CommandBuffer **)local_b8._24_8_;
                    auVar23 = maxps(ZEXT816(0),auVar19);
                    local_b8._0_4_ = (undefined4)auVar23._0_4_;
                    local_b8._4_4_ = (undefined4)auVar23._4_4_;
                    fVar21 = fVar21 - auVar23._0_4_;
                    fVar22 = fVar22 - auVar23._4_4_;
                    local_b8._8_4_ = (undefined4)fVar21;
                    local_b8._12_4_ = (undefined4)fVar22;
                    local_b8._8_4_ =
                         (int)(fVar21 - 2.1474836e+09) & (int)local_b8._8_4_ >> 0x1f |
                         local_b8._8_4_;
                    local_b8._12_4_ =
                         (int)(fVar22 - 2.1474836e+09) & (int)local_b8._12_4_ >> 0x1f |
                         local_b8._12_4_;
                    __l._M_len = 1;
                    __l._M_array = (iterator)local_b8;
                    std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
                              ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)local_88,__l,&local_c1
                              );
                    CommandBuffer::CmdSetScissor
                              (this_00,(vector<VkRect2D,_std::allocator<VkRect2D>_> *)local_88);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._0_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
                    }
                    CommandBuffer::CmdDrawIndexed
                              (*(CommandBuffer **)local_b8._24_8_,
                               *(uint32_t *)((long)&pIVar8->ElemCount + lVar16),1,
                               *(int *)((long)&pIVar8->IdxOffset + lVar16) + local_d0,
                               *(int *)((long)&pIVar8->VtxOffset + lVar16) + local_cc,0);
                  }
                }
              }
            }
            else if (pcVar9 == (code *)0xffffffffffffffff) {
              setup_render_state((ImGuiRenderer *)local_b8._32_8_,
                                 (Ptr<CommandBuffer> *)local_b8._24_8_,local_bc,local_c0,
                                 current_frame);
            }
            else {
              (*pcVar9)(pIVar7,(long)&(pIVar8->ClipRect).x + lVar16);
            }
            lVar15 = lVar15 + 1;
            lVar16 = lVar16 + 0x38;
          } while (lVar15 < (pIVar7->CmdBuffer).Size);
        }
        local_d0 = local_d0 + (pIVar7->IdxBuffer).Size;
        local_cc = local_cc + (pIVar7->VtxBuffer).Size;
        local_50 = local_50 + 1;
      } while (local_50 < local_58->CmdListsCount);
    }
  }
  return;
}

Assistant:

void ImGuiRenderer::CmdDrawPipeline(const Ptr<CommandBuffer> &command_buffer, uint32_t current_frame) const {
	const Ptr<Device> &device = command_buffer->GetDevicePtr();

	ImDrawData *draw_data = ImGui::GetDrawData();

	int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
	int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
	if (fb_width <= 0 || fb_height <= 0 || draw_data->TotalVtxCount == 0)
		return;

	auto &vertex_buffer = m_vertex_buffers[current_frame];
	auto &index_buffer = m_index_buffers[current_frame];
	// Fill vertex buffer and index buffer
	{
		VkDeviceSize vertex_size = draw_data->TotalVtxCount * sizeof(ImDrawVert);
		VkDeviceSize index_size = draw_data->TotalIdxCount * sizeof(ImDrawIdx);
		if (!vertex_buffer || vertex_buffer->GetSize() < vertex_size || vertex_buffer->GetSize() > vertex_size * 4) {
			vertex_buffer =
			    Buffer::Create(device, vertex_size * 2,
			                   VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT | VMA_ALLOCATION_CREATE_MAPPED_BIT,
			                   VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		}
		if (!index_buffer || index_buffer->GetSize() < index_size || index_buffer->GetSize() > index_size * 4) {
			index_buffer = Buffer::Create(
			    device, index_size * 2, VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT | VMA_ALLOCATION_CREATE_MAPPED_BIT,
			    VK_BUFFER_USAGE_INDEX_BUFFER_BIT);
		}

		auto *vertex_ptr = (ImDrawVert *)vertex_buffer->GetMappedData();
		auto *index_ptr = (ImDrawIdx *)index_buffer->GetMappedData();
		for (int i = 0; i < draw_data->CmdListsCount; ++i) {
			const ImDrawList *cmd_list = draw_data->CmdLists[i];
			std::copy(cmd_list->VtxBuffer.begin(), cmd_list->VtxBuffer.end(), vertex_ptr);
			std::copy(cmd_list->IdxBuffer.begin(), cmd_list->IdxBuffer.end(), index_ptr);
			vertex_ptr += cmd_list->VtxBuffer.Size;
			index_ptr += cmd_list->IdxBuffer.Size;
		}
	}

	setup_render_state(command_buffer, fb_width, fb_height, current_frame);

	// Will project scissor/clipping rectangles into framebuffer space
	ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
	ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

	// Render command lists
	// (Because we merged all buffers into a single one, we maintain our own offset into them)
	int global_vtx_offset = 0;
	int global_idx_offset = 0;
	for (int n = 0; n < draw_data->CmdListsCount; n++) {
		const ImDrawList *cmd_list = draw_data->CmdLists[n];
		for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++) {
			const ImDrawCmd *pcmd = &cmd_list->CmdBuffer[cmd_i];
			if (pcmd->UserCallback) {
				// User callback, registered via ImDrawList::AddCallback()
				// (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer
				// to reset render state.)
				if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
					setup_render_state(command_buffer, fb_width, fb_height, current_frame);
				else
					pcmd->UserCallback(cmd_list, pcmd);
			} else {
				// Project scissor/clipping rectangles into framebuffer space
				ImVec4 clip_rect;
				clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
				clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
				clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
				clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

				if (clip_rect.x < (float)fb_width && clip_rect.y < (float)fb_height && clip_rect.z >= 0.0f &&
				    clip_rect.w >= 0.0f) {
					// Negative offsets are illegal for vkCmdSetScissor
					if (clip_rect.x < 0.0f)
						clip_rect.x = 0.0f;
					if (clip_rect.y < 0.0f)
						clip_rect.y = 0.0f;

					// Apply scissor/clipping rectangle
					VkRect2D scissor;
					scissor.offset.x = (int32_t)clip_rect.x;
					scissor.offset.y = (int32_t)clip_rect.y;
					scissor.extent.width = (uint32_t)(clip_rect.z - clip_rect.x);
					scissor.extent.height = (uint32_t)(clip_rect.w - clip_rect.y);
					command_buffer->CmdSetScissor({scissor});
					command_buffer->CmdDrawIndexed(pcmd->ElemCount, 1, pcmd->IdxOffset + global_idx_offset,
					                               pcmd->VtxOffset + global_vtx_offset, 0);
				}
			}
		}
		global_idx_offset += cmd_list->IdxBuffer.Size;
		global_vtx_offset += cmd_list->VtxBuffer.Size;
	}
}